

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

bool __thiscall RigidBodyDynamics::ConstraintSet::Bind(ConstraintSet *this,Model *model)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *_this;
  long lVar1;
  pointer pVVar2;
  void *pvVar3;
  double dVar4;
  void *__ptr;
  double dVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  pointer pVVar8;
  pointer pVVar9;
  RBDLError *this_00;
  undefined8 *puVar10;
  Index dstCols;
  ulong uVar11;
  long lVar12;
  Index new_rows;
  ActualDstType actualDst_5;
  Index dstRows_2;
  int iVar13;
  Index new_rows_3;
  ulong uVar14;
  ActualDstType actualDst_3;
  ActualDstType actualDst;
  allocator_type local_199;
  value_type local_198;
  string local_178;
  undefined1 local_158 [56];
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double local_50;
  double dStack_48;
  double local_40;
  
  if (this[4] != (ConstraintSet)0x0) {
    this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Error: binding an already bound constraint set!\n","");
    Errors::RBDLError::RBDLError(this_00,&local_178);
    __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  lVar12 = *(long *)(this + 200);
  if (*(long *)(this + 0xd0) != lVar12) {
    uVar14 = 0;
    uVar11 = 1;
    do {
      puVar10 = *(undefined8 **)(lVar12 + uVar14 * 0x10);
      (**(code **)*puVar10)(puVar10,model);
      lVar12 = *(long *)(this + 200);
      bVar6 = uVar11 < (ulong)(*(long *)(this + 0xd0) - lVar12 >> 4);
      uVar14 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar6);
  }
  if (*(ulong *)(this + 0x628) != (ulong)model->qdot_size) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x620),
               (ulong)model->qdot_size,1);
  }
  if (0 < *(long *)(this + 0x628)) {
    memset(*(void **)(this + 0x620),0,*(long *)(this + 0x628) << 3);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x630),
             (ulong)model->qdot_size,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x640),
             (ulong)model->qdot_size,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x650),
             (ulong)model->qdot_size,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x660),
             (ulong)model->qdot_size,1);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x8b0),(ulong)model->qdot_size * 3,3,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x8c8),(ulong)model->qdot_size * 3,3,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x8e0),(ulong)model->qdot_size * 3,3,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x8f8),(ulong)model->qdot_size * 3,3,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x910),(ulong)model->qdot_size * 6,6,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x928),(ulong)model->qdot_size * 6,6,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x940),(ulong)model->qdot_size * 6,6,
             (ulong)model->qdot_size);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x958),(ulong)model->qdot_size * 6,6,
             (ulong)model->qdot_size);
  lVar12 = *(long *)(this + 0x10);
  lVar1 = *(long *)(this + 8);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x160),
        (ulong)model->dof_count,(ulong)model->dof_count);
  if (0 < *(long *)(this + 0x170) * *(long *)(this + 0x168)) {
    memset(*(void **)(this + 0x160),0,*(long *)(this + 0x170) * *(long *)(this + 0x168) * 8);
  }
  uVar14 = lVar12 - lVar1 >> 2;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x178),(ulong)model->dof_count,
             (ulong)model->dof_count,1);
  if (0 < *(long *)(this + 0x180)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x178))->m_data,0,
           *(long *)(this + 0x180) << 3);
  }
  iVar13 = (int)uVar14;
  uVar14 = uVar14 & 0xffffffff;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x188),uVar14,uVar14,1);
  if (0 < *(long *)(this + 400)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x188))->m_data,0,
           *(long *)(this + 400) << 3);
  }
  _this = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x198);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run(_this,uVar14,(ulong)model->dof_count);
  if (0 < *(long *)(this + 0x1a8) * *(long *)(this + 0x1a0)) {
    memset(*(void **)_this,0,*(long *)(this + 0x1a8) * *(long *)(this + 0x1a0) * 8);
  }
  uVar11 = (ulong)(model->dof_count + iVar13);
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1b0),uVar11,uVar11);
  if (0 < *(long *)(this + 0x1c0) * *(long *)(this + 0x1b8)) {
    memset(*(void **)(this + 0x1b0),0,*(long *)(this + 0x1c0) * *(long *)(this + 0x1b8) * 8);
  }
  uVar11 = (ulong)(model->dof_count + iVar13);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x1c8),uVar11,uVar11,1);
  if (0 < *(long *)(this + 0x1d0)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x1c8))->m_data,0,
           *(long *)(this + 0x1d0) << 3);
  }
  uVar11 = (ulong)(iVar13 + model->dof_count);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x1d8),uVar11,uVar11,1);
  if (0 < *(long *)(this + 0x1e0)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x1d8))->m_data,0,
           *(long *)(this + 0x1e0) << 3);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x1e8),
        (ulong)model->dof_count,(ulong)model->dof_count);
  if (0 < *(long *)(this + 0x1f8) * *(long *)(this + 0x1f0)) {
    memset(*(void **)(this + 0x1e8),0,*(long *)(this + 0x1f8) * *(long *)(this + 0x1f0) * 8);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x218),
        (ulong)model->dof_count,(ulong)model->dof_count);
  local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = (double)_this;
  Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  HouseholderQR<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_158,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_198);
  pVVar2 = *(pointer *)(this + 0x380);
  *(undefined8 *)(this + 0x380) = local_158._0_8_;
  pVVar8 = *(pointer *)(this + 0x388);
  pVVar9 = *(pointer *)(this + 0x390);
  *(undefined8 *)(this + 0x388) = local_158._8_8_;
  *(undefined8 *)(this + 0x390) = local_158._16_8_;
  pvVar3 = *(void **)(this + 0x398);
  *(undefined8 *)(this + 0x398) = local_158._24_8_;
  dVar4 = *(double *)(this + 0x3a0);
  *(undefined8 *)(this + 0x3a0) = local_158._32_8_;
  __ptr = *(void **)(this + 0x3a8);
  *(undefined8 *)(this + 0x3a8) = local_158._40_8_;
  dVar5 = *(double *)(this + 0x3b0);
  *(undefined8 *)(this + 0x3b0) = local_158._48_8_;
  this[0x3b8] = local_120._0_1_;
  local_158._0_8_ = pVVar2;
  local_158._8_8_ = pVVar8;
  local_158._16_8_ = pVVar9;
  local_158._24_8_ = pvVar3;
  local_158._32_8_ = dVar4;
  local_158._40_8_ = __ptr;
  local_158._48_8_ = dVar5;
  free(__ptr);
  free((void *)local_158._24_8_);
  free((void *)local_158._0_8_);
  uVar11 = CONCAT44(0,model->dof_count);
  if ((*(ulong *)(this + 0x460) != uVar11) || (*(ulong *)(this + 0x468) != uVar11)) {
    if ((uVar11 != 0) &&
       (auVar7._8_8_ = 0, auVar7._0_8_ = uVar11,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar7,0) < uVar11))
    goto LAB_00139b2c;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x458),uVar11 * uVar11,uVar11,uVar11);
  }
  if (0 < *(long *)(this + 0x460) * *(long *)(this + 0x468)) {
    memset(((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x458))->m_data,0,
           *(long *)(this + 0x460) * *(long *)(this + 0x468) * 8);
  }
  uVar11 = (ulong)model->dof_count;
  lVar12 = *(long *)(this + 0x1a0);
  if ((*(ulong *)(this + 0x490) != uVar11) || (*(long *)(this + 0x498) != lVar12)) {
    if ((lVar12 != 0 && uVar11 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar12),0) <
        (long)uVar11)) goto LAB_00139b2c;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x488),lVar12 * uVar11,uVar11,lVar12);
  }
  if (0 < *(long *)(this + 0x490) * *(long *)(this + 0x498)) {
    memset(((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x488))->m_data,0,
           *(long *)(this + 0x490) * *(long *)(this + 0x498) * 8);
  }
  uVar11 = (ulong)model->dof_count;
  lVar12 = uVar11 - *(ulong *)(this + 0x1a0);
  if ((*(ulong *)(this + 0x4a8) != uVar11) || (*(long *)(this + 0x4b0) != lVar12)) {
    if ((uVar11 != *(ulong *)(this + 0x1a0) && uVar11 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar12),0) <
        (long)uVar11)) {
LAB_00139b2c:
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_new;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x4a0),lVar12 * uVar11,uVar11,lVar12);
  }
  if (0 < *(long *)(this + 0x4a8) * *(long *)(this + 0x4b0)) {
    memset(((DenseStorage<double,__1,__1,__1,_0> *)(this + 0x4a0))->m_data,0,
           *(long *)(this + 0x4a8) * *(long *)(this + 0x4b0) * 8);
  }
  if (*(ulong *)(this + 0x4d8) != (ulong)model->dof_count) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x4d0),
               (ulong)model->dof_count,1);
  }
  if (0 < *(long *)(this + 0x4d8)) {
    memset(*(void **)(this + 0x4d0),0,*(long *)(this + 0x4d8) << 3);
  }
  if (*(ulong *)(this + 0x4e8) != (ulong)model->dof_count) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x4e0),
               (ulong)model->dof_count,1);
  }
  if (0 < *(long *)(this + 0x4e8)) {
    memset(*(void **)(this + 0x4e0),0,*(long *)(this + 0x4e8) << 3);
  }
  Eigen::internal::
  conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
  ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(this + 0x4f0),uVar14,uVar14);
  if (0 < *(long *)(this + 0x500) * *(long *)(this + 0x4f8)) {
    memset(*(void **)(this + 0x4f0),0,*(long *)(this + 0x500) * *(long *)(this + 0x4f8) * 8);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x508),uVar14,uVar14,1);
  if (0 < *(long *)(this + 0x510)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x508))->m_data,0,
           *(long *)(this + 0x510) << 3);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x518),(ulong)model->dof_count,
             (ulong)model->dof_count,1);
  if (0 < *(long *)(this + 0x520)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x518))->m_data,0,
           *(long *)(this + 0x520) << 3);
  }
  local_158._32_8_ = 0.0;
  local_158._40_8_ = 0.0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = 0.0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x538),
             uVar14,(value_type *)local_158);
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::resize
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x568),uVar14,
             (value_type *)local_158);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x528),(ulong)model->dof_count,
             (ulong)model->dof_count,1);
  if (0 < *(long *)(this + 0x530)) {
    memset(((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x528))->m_data,0,
           *(long *)(this + 0x530) << 3);
  }
  local_158._32_8_ = 0.0;
  local_158._40_8_ = 0.0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = 0.0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x550),
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)local_158);
  local_158._32_8_ = 0.0;
  local_158._40_8_ = 0.0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = 0.0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_198,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)local_158,&local_199);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x580),
             (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_198);
  if ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
      local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] != (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0) {
    free((void *)local_198.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  local_158._32_8_ = 0.0;
  local_158._40_8_ = 0.0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = 0.0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_198,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)local_158,&local_199);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x598),
             (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_198);
  if ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
      local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] != (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0) {
    free((void *)local_198.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  lVar12 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (*(long *)(this + 0x5b8) != lVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x5b0),lVar12,1);
  }
  if (0 < *(long *)(this + 0x5b8)) {
    memset(*(void **)(this + 0x5b0),0,*(long *)(this + 0x5b8) << 3);
  }
  local_158._0_8_ = (pointer)0x3ff0000000000000;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = 0.0;
  local_158._32_8_ = 0.0;
  local_158._40_8_ = 0.0;
  local_158._48_8_ = 0.0;
  local_120 = 1.0;
  local_118 = 0.0;
  dStack_110 = 0.0;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_f8 = 0.0;
  dStack_f0 = 0.0;
  local_e8 = 1.0;
  local_e0 = 0.0;
  dStack_d8 = 0.0;
  local_d0 = 0.0;
  dStack_c8 = 0.0;
  local_c0 = 0.0;
  dStack_b8 = 0.0;
  local_b0 = 1.0;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_78 = 1.0;
  local_50 = 0.0;
  dStack_48 = 0.0;
  local_60 = 0.0;
  dStack_58 = 0.0;
  local_70 = 0.0;
  dStack_68 = 0.0;
  local_40 = 1.0;
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::vector
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)&local_198,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)local_158,(allocator_type *)&local_199);
  std::vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_>::operator=
            ((vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)(this + 0x5c0),
             (vector<SpatialMatrix_t,_Eigen::aligned_allocator<SpatialMatrix_t>_> *)&local_198);
  if ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
      local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] != (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0) {
    free((void *)local_198.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  local_158._32_8_ = 0.0;
  local_158._40_8_ = 0.0;
  local_158._16_8_ = (pointer)0x0;
  local_158._24_8_ = 0.0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::vector
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_198,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,
             (value_type *)local_158,&local_199);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator=
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(this + 0x5d8),
             (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)&local_198);
  if ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
      local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] != (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x0) {
    free((void *)local_198.super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
  }
  lVar12 = ((long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model->mBodies).
                  super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  .
                  super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (*(long *)(this + 0x5f8) != lVar12) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x5f0),lVar12,1);
  }
  if (0 < *(long *)(this + 0x5f8)) {
    memset(*(void **)(this + 0x5f0),0,*(long *)(this + 0x5f8) << 3);
  }
  local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  local_198.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)local_158,
             ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7,&local_198,
             (allocator_type *)&local_199);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::_M_move_assign
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(this + 0x600),
             (vector<Vector3_t,_std::allocator<Vector3_t>_> *)local_158);
  if ((pointer)local_158._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  this[4] = (ConstraintSet)0x1;
  return true;
}

Assistant:

bool ConstraintSet::Bind (const Model &model)
{
  assert (bound == false);

  if (bound) {
    throw Errors::RBDLError("Error: binding an already bound constraint set!\n");
  }
  for(unsigned int i=0; i<constraints.size(); ++i) {
    constraints[i]->bind(model);
  }

  cache.vecNZeros = VectorNd::Zero(model.qdot_size);
  cache.vecNA.resize(model.qdot_size,1);
  cache.vecNB.resize(model.qdot_size,1);
  cache.vecNC.resize(model.qdot_size,1);
  cache.vecND.resize(model.qdot_size,1);

  cache.mat3NA.resize(3, model.qdot_size);
  cache.mat3NB.resize(3, model.qdot_size);
  cache.mat3NC.resize(3, model.qdot_size);
  cache.mat3ND.resize(3, model.qdot_size);

  cache.mat6NA.resize(6, model.qdot_size);
  cache.mat6NB.resize(6, model.qdot_size);
  cache.mat6NC.resize(6, model.qdot_size);
  cache.mat6ND.resize(6, model.qdot_size);


  unsigned int n_constr = size();

  H.conservativeResize (model.dof_count, model.dof_count);
  H.setZero();
  C.conservativeResize (model.dof_count);
  C.setZero();
  gamma.conservativeResize (n_constr);
  gamma.setZero();
  G.conservativeResize (n_constr, model.dof_count);
  G.setZero();
  A.conservativeResize (model.dof_count + n_constr, model.dof_count + n_constr);
  A.setZero();
  b.conservativeResize (model.dof_count + n_constr);
  b.setZero();
  x.conservativeResize (model.dof_count + n_constr);
  x.setZero();


  S.conservativeResize(model.dof_count, model.dof_count);
  S.setZero();
  W.conservativeResize(model.dof_count, model.dof_count);
  W.Identity(model.dof_count, model.dof_count);

  // HouseHolderQR crashes if matrix G has more rows than columns.
#ifndef RBDL_USE_CASADI_MATH
  GT_qr = Eigen::HouseholderQR<Math::MatrixNd> (G.transpose());
#endif
  GT_qr_Q = MatrixNd::Zero (model.dof_count, model.dof_count);
  Y = MatrixNd::Zero (model.dof_count, G.rows());
  Z = MatrixNd::Zero (model.dof_count, model.dof_count - G.rows());
  qddot_y = VectorNd::Zero (model.dof_count);
  qddot_z = VectorNd::Zero (model.dof_count);

  K.conservativeResize (n_constr, n_constr);
  K.setZero();
  a.conservativeResize (n_constr);
  a.setZero();
  QDDot_t.conservativeResize (model.dof_count);
  QDDot_t.setZero();
  f_t.resize (n_constr, SpatialVector::Zero());
  point_accel_0.resize (n_constr, Vector3d::Zero());

  QDDot_0.conservativeResize (model.dof_count);
  QDDot_0.setZero();


  f_ext_constraints.resize (model.mBodies.size(), SpatialVector::Zero());


  d_pA =std::vector<SpatialVector> (model.mBodies.size(),SpatialVector::Zero());
  d_a = std::vector<SpatialVector> (model.mBodies.size(),SpatialVector::Zero());
  d_u = VectorNd::Zero (model.mBodies.size());

  d_IA = std::vector<SpatialMatrix> (model.mBodies.size()
                                     , SpatialMatrix::Identity());
  d_U = std::vector<SpatialVector> (model.mBodies.size(),SpatialVector::Zero());
  d_d = VectorNd::Zero (model.mBodies.size());

  d_multdof3_u = std::vector<Math::Vector3d> (model.mBodies.size()
                 , Math::Vector3d::Zero());

  bound = true;

  return bound;
}